

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfp_helper.c
# Opt level: O0

void helper_dctdp(CPUPPCState_conflict *env,ppc_fprp_t *t,ppc_fprp_t *b)

{
  decimal32 local_10c;
  undefined1 auStack_108 [4];
  uint32_t b_short;
  ppc_vsr_t vb;
  PPC_DFP dfp;
  ppc_fprp_t *b_local;
  ppc_fprp_t *t_local;
  CPUPPCState_conflict *env_local;
  
  get_dfp64((ppc_vsr_t *)auStack_108,b);
  dfp_prepare_decimal64((PPC_DFP *)(vb.u8 + 8),(ppc_fprp_t *)0x0,(ppc_fprp_t *)0x0,env);
  decimal32ToNumber(&local_10c,(decNumber_conflict1 *)((long)&dfp.vb + 8));
  dfp_finalize_decimal64((PPC_DFP *)(vb.u8 + 8));
  set_dfp64(t,(ppc_vsr_t *)&dfp.field_0x8);
  dfp_set_FPRF_from_FRT((PPC_DFP *)(vb.u8 + 8));
  return;
}

Assistant:

void helper_dctdp(CPUPPCState *env, ppc_fprp_t *t, ppc_fprp_t *b)
{
    struct PPC_DFP dfp;
    ppc_vsr_t vb;
    uint32_t b_short;

    get_dfp64(&vb, b);
    b_short = (uint32_t)vb.VsrD(1);

    dfp_prepare_decimal64(&dfp, 0, 0, env);
    decimal32ToNumber((decimal32 *)&b_short, &dfp.t);
    dfp_finalize_decimal64(&dfp);
    set_dfp64(t, &dfp.vt);
    dfp_set_FPRF_from_FRT(&dfp);
}